

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O2

void __thiscall
burst::dynamic_tuple::accomodate<int&>(dynamic_tuple *this,int *object,int8_t *creation_place)

{
  size_t sVar1;
  object_info_t local_20;
  
  *(int *)creation_place = *object;
  sVar1 = (long)creation_place -
          (long)(this->m_data)._M_t.
                super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
                super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
                super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
  local_20.manage = management::manage<int>;
  local_20.offset = sVar1;
  std::vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>::
  emplace_back<burst::management::object_info_t>(&this->m_objects,&local_20);
  this->m_volume = sVar1 + 4;
  return;
}

Assistant:

void accomodate (T && object, std::int8_t * creation_place)
        {
            using raw_type = std::decay_t<T>;
            new (creation_place) raw_type(std::forward<T>(object));

            const auto new_offset = static_cast<std::size_t>(creation_place - data());
            m_objects.push_back(management::make_object_info<raw_type>(new_offset));
            m_volume = new_offset + sizeof(raw_type);
        }